

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_ptr.hpp
# Opt level: O0

qsbr_ptr<const_std::byte> * __thiscall
unodb::qsbr_ptr<const_std::byte>::operator=
          (qsbr_ptr<const_std::byte> *this,qsbr_ptr<const_std::byte> *other)

{
  byte *pbVar1;
  void *local_20;
  qsbr_ptr<const_std::byte> *local_18;
  qsbr_ptr<const_std::byte> *other_local;
  qsbr_ptr<const_std::byte> *this_local;
  
  local_18 = other;
  other_local = this;
  detail::qsbr_ptr_base::unregister_active_ptr(this->ptr);
  local_20 = (void *)0x0;
  pbVar1 = std::exchange<std::byte_const*,decltype(nullptr)>(&local_18->ptr,&local_20);
  this->ptr = pbVar1;
  return this;
}

Assistant:

UNODB_DETAIL_RELEASE_CONSTEXPR qsbr_ptr &operator=(
      qsbr_ptr &&other) noexcept {
#ifndef NDEBUG
    unregister_active_ptr(ptr);
#endif
    ptr = std::exchange(other.ptr, nullptr);
    return *this;
  }